

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# frm_driver.c
# Opt level: O2

int Field_Editing(_func_int_FORM_ptr *fct,FORM *form)

{
  int iVar1;
  code *fct_00;
  
  if (fct == FE_Delete_Previous) {
    if ((((form->opts & 2) == 0) || (form->currow != 0)) || (form->curcol != 0)) goto LAB_003c69d1;
    fct_00 = FN_Previous_Field;
  }
  else {
    if (fct != FE_New_Line) {
LAB_003c69d1:
      if ((form->current->opts & 8) == 0) {
        iVar1 = -0xc;
      }
      else {
        iVar1 = (*fct)(form);
        if (iVar1 == 0) {
          *(byte *)&form->status = (byte)form->status | 0x10;
          iVar1 = 0;
        }
      }
      return iVar1;
    }
    if ((((form->opts & 1) == 0) || (form->currow != 0)) || (form->curcol != 0)) {
      iVar1 = FE_New_Line(form);
      return iVar1;
    }
    fct_00 = FN_Next_Field;
  }
  iVar1 = Inter_Field_Navigation(fct_00,form);
  return iVar1;
}

Assistant:

static int Field_Editing(int (* const fct) (FORM *), FORM * form)
{
  int res = E_REQUEST_DENIED;

  /* We have to deal here with the specific case of the overloaded 
     behaviour of New_Line and Delete_Previous requests.
     They may end up in navigational requests if we are on the first
     character in a field. But navigation is also allowed on non-
     editable fields.
  */ 
  if ((fct==FE_Delete_Previous)            && 
      (form->opts & O_BS_OVERLOAD)         &&
      First_Position_In_Current_Field(form) )
    {
      res = Inter_Field_Navigation(FN_Previous_Field,form);
    }
  else
    {
      if (fct==FE_New_Line)
        {
          if ((form->opts & O_NL_OVERLOAD)         &&
              First_Position_In_Current_Field(form))
            {
              res = Inter_Field_Navigation(FN_Next_Field,form);
            }
          else
            /* FE_New_Line deals itself with the _WINDOW_MODIFIED flag */
            res = fct(form);
        }
      else
        {
          /* From now on, everything must be editable */
          if (form->current->opts & O_EDIT)
            {
              res = fct(form);
              if (res==E_OK)
                form->status |= _WINDOW_MODIFIED;
            }
        }
    }
  return res;
}